

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

void __thiscall
Fl_Input_Choice::Fl_Input_Choice(Fl_Input_Choice *this,int X,int Y,int W,int H,char *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Input *this_00;
  InputMenuButton *this_01;
  char *L_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Input_Choice *this_local;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,X,Y,W,H,L);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Input_Choice_002eb9a8;
  Fl_Widget::box((Fl_Widget *)this,FL_DOWN_BOX);
  Fl_Widget::align((Fl_Widget *)this,4);
  this_00 = (Fl_Input *)operator_new(200);
  iVar1 = inp_x(this);
  iVar2 = inp_y(this);
  iVar3 = inp_w(this);
  iVar4 = inp_h(this);
  Fl_Input::Fl_Input(this_00,iVar1,iVar2,iVar3,iVar4,(char *)0x0);
  this->inp_ = this_00;
  Fl_Widget::callback((Fl_Widget *)this->inp_,inp_cb,this);
  Fl_Widget::box((Fl_Widget *)this->inp_,FL_FLAT_BOX);
  Fl_Widget::when((Fl_Widget *)this->inp_,'\x03');
  this_01 = (InputMenuButton *)operator_new(0x98);
  iVar1 = menu_x(this);
  iVar2 = menu_y(this);
  iVar3 = menu_w(this);
  iVar4 = menu_h(this);
  InputMenuButton::InputMenuButton(this_01,iVar1,iVar2,iVar3,iVar4,(char *)0x0);
  this->menu_ = this_01;
  Fl_Widget::callback((Fl_Widget *)this->menu_,menu_cb,this);
  Fl_Widget::box((Fl_Widget *)this->menu_,FL_FLAT_BOX);
  Fl_Group::end(&this->super_Fl_Group);
  return;
}

Assistant:

Fl_Input_Choice::Fl_Input_Choice (int X,int Y,int W,int H,const char*L) 
: Fl_Group(X,Y,W,H,L) 
{
  Fl_Group::box(FL_DOWN_BOX);
  align(FL_ALIGN_LEFT);				// default like Fl_Input
  inp_ = new Fl_Input(inp_x(), inp_y(),
                      inp_w(), inp_h());
  inp_->callback(inp_cb, (void*)this);
  inp_->box(FL_FLAT_BOX);		// cosmetic
  inp_->when(FL_WHEN_CHANGED|FL_WHEN_NOT_CHANGED);
  menu_ = new InputMenuButton(menu_x(), menu_y(),
                              menu_w(), menu_h());
  menu_->callback(menu_cb, (void*)this);
  menu_->box(FL_FLAT_BOX);				// cosmetic
  end();
}